

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.hh
# Opt level: O3

void __thiscall
QPDF::EncryptionData::EncryptionData
          (EncryptionData *this,int V,int R,int Length_bytes,int P,string *O,string *U,string *OE,
          string *UE,string *Perms,string *id1,bool encrypt_metadata)

{
  pointer pcVar1;
  
  this->V = V;
  this->R = R;
  this->Length_bytes = Length_bytes;
  this->P = P;
  (this->O)._M_dataplus._M_p = (pointer)&(this->O).field_2;
  pcVar1 = (O->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->O,pcVar1,pcVar1 + O->_M_string_length);
  (this->U)._M_dataplus._M_p = (pointer)&(this->U).field_2;
  pcVar1 = (U->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->U,pcVar1,pcVar1 + U->_M_string_length);
  (this->OE)._M_dataplus._M_p = (pointer)&(this->OE).field_2;
  pcVar1 = (OE->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->OE,pcVar1,pcVar1 + OE->_M_string_length);
  (this->UE)._M_dataplus._M_p = (pointer)&(this->UE).field_2;
  pcVar1 = (UE->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->UE,pcVar1,pcVar1 + UE->_M_string_length);
  (this->Perms)._M_dataplus._M_p = (pointer)&(this->Perms).field_2;
  pcVar1 = (Perms->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Perms,pcVar1,pcVar1 + Perms->_M_string_length);
  (this->id1)._M_dataplus._M_p = (pointer)&(this->id1).field_2;
  pcVar1 = (id1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id1,pcVar1,pcVar1 + id1->_M_string_length);
  this->encrypt_metadata = encrypt_metadata;
  return;
}

Assistant:

EncryptionData(
            int V,
            int R,
            int Length_bytes,
            int P,
            std::string const& O,
            std::string const& U,
            std::string const& OE,
            std::string const& UE,
            std::string const& Perms,
            std::string const& id1,
            bool encrypt_metadata) :
            V(V),
            R(R),
            Length_bytes(Length_bytes),
            P(P),
            O(O),
            U(U),
            OE(OE),
            UE(UE),
            Perms(Perms),
            id1(id1),
            encrypt_metadata(encrypt_metadata)
        {
        }